

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to)

{
  IRContext *this_00;
  undefined8 *puVar1;
  pointer pOVar2;
  pointer pOVar3;
  iterator iVar4;
  Instruction *pIVar5;
  Operand *pOVar6;
  unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  uVar7;
  uint32_t i;
  uint32_t index;
  undefined8 *puVar8;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_e8;
  uint32_t from_local;
  pointer local_e0;
  pointer local_d8;
  Operand op;
  Operand local_a0;
  SmallVector<unsigned_int,_2UL> local_70;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  
  from_local = from;
  iVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&from_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur != (__node_type *)0x0) {
    this_00 = this->module_->context_;
    puVar1 = *(undefined8 **)
              ((long)iVar4.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ._M_cur + 0x18);
    for (puVar8 = *(undefined8 **)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x10); puVar8 != puVar1; puVar8 = puVar8 + 1) {
      pIVar5 = Instruction::Clone((Instruction *)*puVar8,this->module_->context_);
      init_list._M_len = 1;
      init_list._M_array = &local_a0.type;
      local_a0.type = to;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)&op,init_list);
      Instruction::SetInOperand(pIVar5,0,(OperandData *)&op);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&op);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                 &(this->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.
                  sentinel_);
      IRContext::AnalyzeUses
                (this_00,(this->module_->annotations_).
                         super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                         super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              (&indirect_decorations,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)((long)iVar4.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x28));
    local_e0 = indirect_decorations.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    while (indirect_decorations.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start != local_e0) {
      pIVar5 = *indirect_decorations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = indirect_decorations.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pIVar5->opcode_ == OpGroupMemberDecorate) {
        IRContext::ForgetUses(this_00,pIVar5);
        pOVar2 = (pIVar5->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pOVar3 = (pIVar5->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (index = 1; index < (uint)(((long)pOVar2 - (long)pOVar3) / 0x30); index = index + 2) {
          pOVar6 = Instruction::GetOperand(pIVar5,index);
          Operand::Operand(&op,pOVar6);
          uVar7 = op.words.large_data_;
          if ((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )op.words.large_data_._M_t.
                super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )0x0) {
            uVar7._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                    )&op.words.small_data_;
          }
          if (**(uint **)uVar7._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                         ._M_head_impl == from_local) {
            init_list_01._M_len = 1;
            init_list_01._M_array = &local_e8;
            local_e8 = to;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list_01);
            local_a0.type = SPV_OPERAND_TYPE_ID;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0.words,&local_70);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,&local_a0);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0.words);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
            pOVar6 = Instruction::GetOperand(pIVar5,index + 1);
            Operand::operator=(&op,pOVar6);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
            emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,&op);
          }
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&op.words);
        }
      }
      else {
        if (pIVar5->opcode_ != OpGroupDecorate) {
          __assert_fail("false && \"Unexpected decoration instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x22d,
                        "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t)"
                       );
        }
        IRContext::ForgetUses(this_00,pIVar5);
        init_list_00._M_len = 1;
        init_list_00._M_array = (iterator)&local_70;
        local_70._vptr_SmallVector._0_4_ = to;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&local_a0,init_list_00);
        op.type = SPV_OPERAND_TYPE_ID;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  (&op.words,(SmallVector<unsigned_int,_2UL> *)&local_a0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,&op);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&op.words);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&local_a0);
      }
      IRContext::AnalyzeUses(this_00,pIVar5);
      indirect_decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start = local_d8 + 1;
    }
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&indirect_decorations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(uint32_t from, uint32_t to) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    // simply clone decoration and change |target-id| to |to|
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }
  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        context->ForgetUses(inst);
        // add |to| to list of decorated id's
        inst->AddOperand(
            Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
        context->AnalyzeUses(inst);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        context->ForgetUses(inst);
        // for each (id == from), add (to, literal) as operands
        const uint32_t num_operands = inst->NumOperands();
        for (uint32_t i = 1; i < num_operands; i += 2) {
          Operand op = inst->GetOperand(i);
          if (op.words[0] == from) {  // add new pair of operands: (to, literal)
            inst->AddOperand(
                Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {to}));
            op = inst->GetOperand(i + 1);
            inst->AddOperand(std::move(op));
          }
        }
        context->AnalyzeUses(inst);
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}